

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.cc
# Opt level: O0

vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
* google::protobuf::compiler::cpp::anon_unknown_0::SortFieldsByNumber
            (vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
             *__return_storage_ptr__,Descriptor *descriptor)

{
  int iVar1;
  FieldDescriptor *pFVar2;
  reference ppFVar3;
  iterator iVar4;
  iterator iVar5;
  int local_30;
  int i;
  allocator<const_google::protobuf::FieldDescriptor_*> local_1a;
  undefined1 local_19;
  Descriptor *local_18;
  Descriptor *descriptor_local;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  *fields;
  
  local_19 = 0;
  local_18 = descriptor;
  descriptor_local = (Descriptor *)__return_storage_ptr__;
  iVar1 = Descriptor::field_count(descriptor);
  std::allocator<const_google::protobuf::FieldDescriptor_*>::allocator(&local_1a);
  std::
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ::vector(__return_storage_ptr__,(long)iVar1,&local_1a);
  std::allocator<const_google::protobuf::FieldDescriptor_*>::~allocator(&local_1a);
  for (local_30 = 0; iVar1 = Descriptor::field_count(local_18), local_30 < iVar1;
      local_30 = local_30 + 1) {
    pFVar2 = Descriptor::field(local_18,local_30);
    ppFVar3 = std::
              vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
              ::operator[](__return_storage_ptr__,(long)local_30);
    *ppFVar3 = pFVar2;
  }
  iVar4 = std::
          vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
          ::begin(__return_storage_ptr__);
  iVar5 = std::
          vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
          ::end(__return_storage_ptr__);
  std::
  sort<__gnu_cxx::__normal_iterator<google::protobuf::FieldDescriptor_const**,std::vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>>,google::protobuf::compiler::cpp::(anonymous_namespace)::FieldOrderingByNumber>
            (iVar4._M_current,iVar5._M_current);
  return __return_storage_ptr__;
}

Assistant:

std::vector<const FieldDescriptor*> SortFieldsByNumber(
    const Descriptor* descriptor) {
  std::vector<const FieldDescriptor*> fields(descriptor->field_count());
  for (int i = 0; i < descriptor->field_count(); ++i) {
    fields[i] = descriptor->field(i);
  }
  std::sort(fields.begin(), fields.end(), FieldOrderingByNumber());
  return fields;
}